

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(cmStateSnapshot *this)

{
  string *psVar1;
  string currentBinDir;
  string currentSrcDir;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_CURRENT_SOURCE_DIR",(allocator<char> *)&local_68);
  psVar1 = GetDefinition(this,&local_48);
  std::__cxx11::string::string((string *)&local_28,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_BINARY_DIR",&local_69);
  psVar1 = GetDefinition(this,&local_68);
  std::__cxx11::string::string((string *)&local_48,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_68);
  InitializeFromParent(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_SOURCE_DIR",&local_69);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_68,psVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_BINARY_DIR",&local_69);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_68,psVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_SOURCE_DIR",&local_69);
  SetDefinition(this,&local_68,&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_BINARY_DIR",&local_69);
  SetDefinition(this,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = *this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = *this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir);
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir);
}